

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  XMLBuffer *this_00;
  XMLStringPool *pXVar1;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar2;
  XSAnnotation *annotation;
  uint uVar3;
  int iVar4;
  XMLCh *pXVar5;
  XMLCh *refName;
  XMLSize_t XVar6;
  DOMElement *contentElem;
  DOMNode *node;
  XercesAttGroupInfo *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SchemaAttDef *pSVar7;
  DOMElement *pDVar8;
  undefined4 extraout_var_02;
  char16_t *pcVar9;
  XercesAttGroupInfo *baseAttGrpInfo;
  SchemaAttDef *pSVar10;
  XMLSize_t k;
  XMLSize_t index;
  bool bVar11;
  bool bVar12;
  DOMElement *elem_local;
  XSAnnotation *local_58;
  MemoryManager *local_50;
  XercesAttGroupInfo *local_48;
  NamespaceScopeManager nsMgr;
  
  elem_local = elem;
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  pXVar5 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  refName = getElementAttValue(this,elem,L"ref",QName);
  if (pXVar5 == (XMLCh *)0x0) {
    bVar11 = false;
  }
  else {
    bVar11 = *pXVar5 != L'\0';
  }
  if (refName == (XMLCh *)0x0) {
    bVar12 = true;
  }
  else {
    bVar12 = *refName == L'\0';
  }
  if (topLevel && !bVar11) {
    this_01 = (XercesAttGroupInfo *)0x0;
    reportSchemaError(this,elem_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x55,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,(XMLCh *)0x0,(XMLCh *)0x0,
                      (XMLCh *)0x0);
    goto LAB_003184f7;
  }
  if (bVar11 || bVar12 != true) {
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,elem_local,topLevel ^ 9,this,topLevel,this->fNonXSAttList);
    if (topLevel) {
      XVar6 = XMLString::stringLen(pXVar5);
      bVar11 = XMLChar1_0::isValidNCName(pXVar5,XVar6);
      pDVar8 = elem_local;
      if (bVar11) {
        contentElem = XUtil::getFirstChildElement(&elem_local->super_DOMNode);
        node = &checkContent(this,pDVar8,contentElem,true,true)->super_DOMNode;
        local_58 = this->fAnnotation;
        if ((local_58 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1)
        {
          if (this->fNonXSAttList->fCurCount == 0) {
            local_58 = (XSAnnotation *)0x0;
          }
          else {
            local_58 = generateSyntheticAnnotation(this,elem_local,this->fNonXSAttList);
            this->fAnnotation = local_58;
          }
        }
        local_48 = this->fCurrentAttGroupInfo;
        local_50 = this->fGrammarPoolMemoryManager;
        this_01 = (XercesAttGroupInfo *)XMemory::operator_new(0x38,local_50);
        uVar3 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fStringPool,pXVar5);
        XercesAttGroupInfo::XercesAttGroupInfo
                  (this_01,uVar3,this->fTargetNSURI,this->fGrammarPoolMemoryManager);
        ValueVectorOf<const_xercesc_4_0::DOMElement_*>::addElement(this->fDeclStack,&elem_local);
        this->fCurrentAttGroupInfo = this_01;
        for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
          iVar4 = (*node->_vptr_DOMNode[0x18])(node);
          bVar11 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar4),
                                     (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE);
          if (bVar11) {
            traverseAttributeDecl(this,(DOMElement *)node,typeInfo,false);
          }
          else {
            iVar4 = (*node->_vptr_DOMNode[0x18])(node);
            bVar11 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar4),
                                       (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP);
            if (!bVar11) {
              iVar4 = (*node->_vptr_DOMNode[0x18])(node);
              bVar11 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar4),
                                         (XMLCh *)SchemaSymbols::fgELT_ANYATTRIBUTE);
              if (bVar11) {
                pSVar7 = traverseAnyAttribute(this,(DOMElement *)node);
                if (pSVar7 != (SchemaAttDef *)0x0) {
                  XercesAttGroupInfo::addAnyAttDef(this->fCurrentAttGroupInfo,pSVar7,false);
                }
                pDVar8 = XUtil::getNextSiblingElement(node);
                if (pDVar8 != (DOMElement *)0x0) {
                  reportSchemaError(this,(DOMElement *)node,(XMLCh *)XMLUni::fgXMLErrDomain,0x65,
                                    pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                }
              }
              else {
                reportSchemaError(this,(DOMElement *)node,(XMLCh *)XMLUni::fgXMLErrDomain,0x65,
                                  pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              }
              break;
            }
            traverseAttributeGroupDecl(this,(DOMElement *)node,typeInfo,false);
          }
        }
        ValueVectorOf<const_xercesc_4_0::DOMElement_*>::removeElementAt
                  (this->fDeclStack,this->fDeclStack->fCurCount - 1);
        pXVar1 = this->fStringPool;
        pRVar2 = this->fAttGroupRegistry;
        uVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
        iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar3);
        RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                  (pRVar2,(void *)CONCAT44(extraout_var_02,iVar4),this_01);
        this->fCurrentAttGroupInfo = local_48;
        this_00 = &this->fBuffer;
        XMLBuffer::set(this_00,this->fTargetNSURIString);
        XMLBuffer::append(this_00,L',');
        XMLBuffer::append(this_00,pXVar5);
        annotation = local_58;
        pXVar1 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
        if (this->fRedefineComponents !=
            (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
          pcVar9 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                             (this->fRedefineComponents,SchemaSymbols::fgELT_ATTRIBUTEGROUP,iVar4);
          if (pcVar9 != (char16_t *)0x0) {
            XMLBuffer::set(this_00,pXVar5);
            XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
            pRVar2 = this->fAttGroupRegistry;
            pXVar5 = (this->fBuffer).fBuffer;
            pXVar5[(this->fBuffer).fIndex] = L'\0';
            baseAttGrpInfo =
                 RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                           (pRVar2,pXVar5);
            if (baseAttGrpInfo != (XercesAttGroupInfo *)0x0) {
              checkAttDerivationOK(this,elem_local,baseAttGrpInfo,this_01);
            }
          }
        }
        if (annotation != (XSAnnotation *)0x0) {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,annotation);
        }
LAB_00318808:
        if (this_01 != (XercesAttGroupInfo *)0x0) {
          if (((this_01->fAnyAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) &&
              (XVar6 = (this_01->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
                       fCurCount, XVar6 != 0)) &&
             (this_01->fCompleteWildCard == (SchemaAttDef *)0x0)) {
            pSVar7 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            pSVar10 = XercesAttGroupInfo::anyAttributeAt(this_01,0);
            SchemaAttDef::SchemaAttDef(pSVar7,pSVar10);
            for (index = 1; XVar6 != index; index = index + 1) {
              pSVar10 = XercesAttGroupInfo::anyAttributeAt(this_01,index);
              attWildCardIntersection(this,pSVar7,pSVar10);
            }
            if (this_01->fCompleteWildCard != (SchemaAttDef *)0x0) {
              (*(this_01->fCompleteWildCard->super_XMLAttDef).super_XSerializable.
                _vptr_XSerializable[1])();
            }
            this_01->fCompleteWildCard = pSVar7;
          }
          goto LAB_003184f7;
        }
      }
      else {
        reportSchemaError(this,elem_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                          (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,pXVar5,(XMLCh *)0x0,
                          (XMLCh *)0x0);
      }
    }
    else if (!bVar12) {
      this_01 = processAttributeGroupRef(this,elem_local,refName,typeInfo);
      goto LAB_00318808;
    }
  }
  else {
    reportSchemaError(this,elem_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x13);
  }
  this_01 = (XercesAttGroupInfo *)0x0;
LAB_003184f7:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return this_01;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh* ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool         nameEmpty = (!name || !*name) ? true : false;
    bool         refEmpty = (!ref || !*ref) ? true : false;

    if (nameEmpty && topLevel) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP);
        return 0;
    }

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttGroup);
        return 0;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_AttributeGroupGlobal
                                      : GeneralAttributeCheck::E_AttributeGroupRef;
    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // ------------------------------------------------------------------
    // Handle "ref="
    // ------------------------------------------------------------------
    XercesAttGroupInfo* attGroupInfo;
    Janitor<XercesAttGroupInfo> janAttGroupInfo(0);
    if (!topLevel) {

        if (refEmpty) {
            return 0;
        }

        attGroupInfo = processAttributeGroupRef(elem, ref, typeInfo);
    }
    else
    {
        // name must be a valid NCName
        if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, name);
            return 0;
        }

        // Check for annotations
        DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
        if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
        {
            fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        }
        Janitor<XSAnnotation> janAnnot(fAnnotation);

        // Process contents of global attributeGroups
        XercesAttGroupInfo* saveAttGroupInfo = fCurrentAttGroupInfo;
        janAttGroupInfo.reset(new (fGrammarPoolMemoryManager) XercesAttGroupInfo(
            fStringPool->addOrFind(name), fTargetNSURI, fGrammarPoolMemoryManager));

        fDeclStack->addElement(elem);
        fCurrentAttGroupInfo = janAttGroupInfo.get();

        for (; content !=0; content = XUtil::getNextSiblingElement(content)) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTE)) {
                traverseAttributeDecl(content, typeInfo);
            }
            else if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
                traverseAttributeGroupDecl(content, typeInfo);
            }
            else {
                break;
            }
        }

        if (content != 0) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANYATTRIBUTE)) {

                SchemaAttDef* anyAtt = traverseAnyAttribute(content);

                if (anyAtt) {
                    fCurrentAttGroupInfo->addAnyAttDef(anyAtt);
                }

                if (XUtil::getNextSiblingElement(content) != 0) {
                    reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
                }
            }
            else {
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
            }
        }

        // Pop declaration
        fDeclStack->removeElementAt(fDeclStack->size() - 1);

        fAttGroupRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), janAttGroupInfo.get());
        // Restore old attGroupInfo
        attGroupInfo = janAttGroupInfo.release();
        fCurrentAttGroupInfo = saveAttGroupInfo;

        // Check Attribute Derivation Restriction OK
        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(name);

        unsigned int nameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());

        if (fRedefineComponents && fRedefineComponents->get(SchemaSymbols::fgELT_ATTRIBUTEGROUP, nameIndex)) {

            fBuffer.set(name);
            fBuffer.append(SchemaSymbols::fgRedefIdentifier);
            XercesAttGroupInfo* baseAttGroupInfo = fAttGroupRegistry->get(fBuffer.getRawBuffer());

            if (baseAttGroupInfo)
                checkAttDerivationOK(elem, baseAttGroupInfo, attGroupInfo);
        }

        // Store annotation
        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(attGroupInfo, janAnnot.release());
    }

    // calculate complete wildcard if necessary
    if (attGroupInfo)
    {
        XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();
        if (anyAttCount && !attGroupInfo->getCompleteWildCard())
        {
            SchemaAttDef* attGroupWildCard =  new (fGrammarPoolMemoryManager)
                SchemaAttDef(attGroupInfo->anyAttributeAt(0));

            for (XMLSize_t k= 1; k < anyAttCount; k++)
                attWildCardIntersection(attGroupWildCard, attGroupInfo->anyAttributeAt(k));

            attGroupInfo->setCompleteWildCard(attGroupWildCard);
        }
    }

    return attGroupInfo;
}